

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O2

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
* __thiscall
iDynTree::XMLParser::XMLParserPimpl::attributesFromArray_abi_cxx11_
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
           *__return_storage_ptr__,XMLParserPimpl *this,xmlChar **attributes,int nb_attributes,
          int nb_defaulted)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_2;
  xmlChar *pxVar1;
  xmlChar *xmlString;
  xmlChar *xmlString_00;
  xmlChar *xmlString_01;
  xmlChar *extraout_RDX;
  xmlChar *pxVar2;
  string value;
  string uri;
  string prefix;
  string name;
  undefined1 local_c0 [32];
  char local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  pxVar2 = (xmlChar *)0x0;
  xmlString = (xmlChar *)((ulong)attributes & 0xffffffff);
  if ((int)attributes < 1) {
    xmlString = pxVar2;
  }
  pxVar1 = (xmlChar *)((long)xmlString * 0x28);
  __args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c0 + 0x10);
  for (; pxVar1 != pxVar2; pxVar2 = pxVar2 + 0x28) {
    stringFromXMLCharPtr_abi_cxx11_
              (&local_50,*(XMLParserPimpl **)(pxVar2 + (long)&this->m_callbackHandler),xmlString);
    stringFromXMLCharPtr_abi_cxx11_
              (&local_70,
               *(XMLParserPimpl **)((long)&(this->m_callbackHandler).isStandalone + (long)pxVar2),
               xmlString_00);
    stringFromXMLCharPtr_abi_cxx11_
              (&local_90,
               *(XMLParserPimpl **)
                ((long)&(this->m_callbackHandler).hasInternalSubset + (long)pxVar2),xmlString_01);
    local_c0._16_8_ = local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__args_2,
               *(undefined8 *)((long)&(this->m_callbackHandler).hasExternalSubset + (long)pxVar2),
               *(undefined8 *)((long)&(this->m_callbackHandler).resolveEntity + (long)pxVar2));
    std::
    make_shared<iDynTree::XMLAttribute,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               &local_50,__args_2,&local_70);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string&,std::shared_ptr<iDynTree::XMLAttribute>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)__return_storage_ptr__,&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
    std::__cxx11::string::~string((string *)__args_2);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    xmlString = extraout_RDX;
  }
  return __return_storage_ptr__;
}

Assistant:

const std::unordered_map<std::string, std::shared_ptr<XMLAttribute>> XMLParser::XMLParserPimpl::attributesFromArray(const xmlChar ** attributes,
                                                                                                       int nb_attributes,
                                                                                                       int nb_defaulted)
    {
        // TODO: how to handle the nb_defaulted parameter
        const int fields = 5;
        std::unordered_map<std::string, std::shared_ptr<XMLAttribute>> mappedAttributes;
        // Array of array. The inner array contains: localname/prefix/URI/value/end
        for (int attributeIndex = 0; attributeIndex < nb_attributes; ++attributeIndex) {
            std::string name = XMLParser::XMLParserPimpl::stringFromXMLCharPtr(attributes[attributeIndex * fields + 0]);
            std::string prefix = XMLParser::XMLParserPimpl::stringFromXMLCharPtr(attributes[attributeIndex * fields + 1]);
            std::string uri = XMLParser::XMLParserPimpl::stringFromXMLCharPtr(attributes[attributeIndex * fields + 2]);
            const xmlChar *value_start = attributes[attributeIndex * fields + 3];
            const xmlChar *value_end = attributes[attributeIndex * fields + 4];
            size_t len = value_end - value_start;
            std::string value(reinterpret_cast<const char*>(value_start), len);
            
            mappedAttributes.emplace(name, std::make_shared<XMLAttribute>(name, value, prefix, uri));
        }
        return mappedAttributes;
    }